

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gog.cpp
# Opt level: O0

void gog::probe_bin_files(extract_options *o,info *info,path *setup_file,bool external)

{
  bool bVar1;
  size_t sVar2;
  type __b;
  uint *puVar3;
  ostream *poVar4;
  shell_command command;
  byte in_CL;
  char *pcVar5;
  long in_RDI;
  size_t in_stack_00000098;
  size_t in_stack_000000a0;
  string *in_stack_000000a8;
  path *in_stack_000000b0;
  info *in_stack_000000b8;
  extract_options *in_stack_000000c0;
  char *verb;
  size_t format;
  size_t slice;
  data_entry *location;
  bool _foreach_continue511;
  auto_any_t _foreach_end511;
  auto_any_t _foreach_cur511;
  auto_any_t _foreach_col511;
  uint32_t max_slice;
  size_t bin_count;
  string basename;
  path dir;
  false_ *in_stack_fffffffffffffdd8;
  shell_command in_stack_fffffffffffffde0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde8;
  auto_any_t in_stack_fffffffffffffdf0;
  char *in_stack_fffffffffffffe00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe08;
  byte local_1c2;
  char *local_158;
  bool local_131;
  __normal_iterator<const_setup::data_entry_*,_std::vector<setup::data_entry,_std::allocator<setup::data_entry>_>_>
  local_130;
  indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
  *local_128;
  __normal_iterator<const_setup::data_entry_*,_std::vector<setup::data_entry,_std::allocator<setup::data_entry>_>_>
  local_120;
  indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
  *local_118;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_110;
  indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
  *local_108;
  uint local_fc;
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  ulong local_98;
  string local_60 [71];
  byte local_19;
  long local_8;
  
  local_19 = in_CL & 1;
  local_8 = in_RDI;
  boost::filesystem::path::parent_path();
  boost::filesystem::path::stem();
  boost::filesystem::path::string<std::__cxx11::string>((path *)in_stack_fffffffffffffde8);
  std::_Destroy<std::__cxx11::string>((path *)0x13f46a);
  local_98 = 0;
  std::operator+(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  sVar2 = anon_unknown_0::probe_bin_file_series
                    (in_stack_000000c0,in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,
                     in_stack_000000a0,in_stack_00000098);
  local_98 = local_98 + sVar2;
  std::__cxx11::string::~string(local_b8);
  std::operator+(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  std::operator+(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0.command);
  sVar2 = anon_unknown_0::probe_bin_file_series
                    (in_stack_000000c0,in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,
                     in_stack_000000a0,in_stack_00000098);
  local_98 = sVar2 + local_98;
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::~string(local_f8);
  local_fc = 0;
  if ((local_19 & 1) != 0) {
    local_110 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                boost::foreach_detail_::contain<std::__cxx11::string_const>
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           in_stack_fffffffffffffde8,(false_ *)in_stack_fffffffffffffde0.command);
    local_108 = (indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
                 *)&local_110;
    bVar1 = boost::iostreams::detail::
            indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
            ::can_write(local_108);
    if (!bVar1) {
      local_120._M_current =
           (data_entry *)
           boost::foreach_detail_::
           begin<std::vector<setup::data_entry,std::allocator<setup::data_entry>>,mpl_::bool_<true>>
                     ((auto_any_t)in_stack_fffffffffffffde8,
                      (type2type<std::vector<setup::data_entry,_std::allocator<setup::data_entry>_>,_mpl_::bool_<true>_>
                       *)in_stack_fffffffffffffde0.command,in_stack_fffffffffffffdd8);
      local_118 = (indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
                   *)&local_120;
      bVar1 = boost::iostreams::detail::
              indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
              ::can_write(local_118);
      if (!bVar1) {
        local_130._M_current =
             (data_entry *)
             boost::foreach_detail_::
             end<std::vector<setup::data_entry,std::allocator<setup::data_entry>>,mpl_::bool_<true>>
                       ((auto_any_t)in_stack_fffffffffffffde8,
                        (type2type<std::vector<setup::data_entry,_std::allocator<setup::data_entry>_>,_mpl_::bool_<true>_>
                         *)in_stack_fffffffffffffde0.command,in_stack_fffffffffffffdd8);
        local_128 = (indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
                     *)&local_130;
        bVar1 = boost::iostreams::detail::
                indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
                ::can_write(local_128);
        if (!bVar1) {
          local_131 = true;
          while( true ) {
            local_1c2 = 0;
            if ((local_131 & 1U) != 0) {
              bVar1 = boost::foreach_detail_::done<std::__cxx11::string,mpl_::bool_<true>>
                                (in_stack_fffffffffffffdf0,(auto_any_t)in_stack_fffffffffffffde8,
                                 (type2type<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_mpl_::bool_<true>_>
                                  *)in_stack_fffffffffffffde0.command);
              local_1c2 = bVar1 ^ 0xff;
            }
            if ((local_1c2 & 1) == 0) break;
            bVar1 = boost::foreach_detail_::set_false(&local_131);
            if (!bVar1) {
              __b = boost::foreach_detail_::deref<std::__cxx11::string,mpl_::bool_<true>>
                              ((auto_any_t)in_stack_fffffffffffffde0.command,
                               (type2type<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_mpl_::bool_<true>_>
                                *)in_stack_fffffffffffffdd8);
              while (((local_131 ^ 0xffU) & 1) != 0) {
                puVar3 = std::max<unsigned_int>(&local_fc,__b);
                local_fc = *puVar3;
                puVar3 = std::max<unsigned_int>(&local_fc,__b + 1);
                local_fc = *puVar3;
                local_131 = true;
              }
            }
            if ((local_131 & 1U) != 0) {
              boost::foreach_detail_::
              next<std::vector<setup::data_entry,std::allocator<setup::data_entry>>,mpl_::bool_<true>>
                        ((auto_any_t)in_stack_fffffffffffffde0.command,
                         (type2type<std::vector<setup::data_entry,_std::allocator<setup::data_entry>_>,_mpl_::bool_<true>_>
                          *)in_stack_fffffffffffffdd8);
            }
          }
        }
      }
    }
  }
  sVar2 = anon_unknown_0::probe_bin_file_series
                    (in_stack_000000c0,in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,
                     in_stack_000000a0,in_stack_00000098);
  local_98 = sVar2 + local_98;
  sVar2 = anon_unknown_0::probe_bin_file_series
                    (in_stack_000000c0,in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,
                     in_stack_000000a0,in_stack_00000098);
  local_98 = sVar2 + local_98;
  if (local_98 != 0) {
    local_158 = "inspecting";
    if ((*(byte *)(local_8 + 8) & 1) == 0) {
      if ((*(byte *)(local_8 + 7) & 1) == 0) {
        if ((*(byte *)(local_8 + 6) & 1) != 0) {
          local_158 = "listing the contents of";
        }
      }
      else {
        local_158 = "testing";
      }
    }
    else {
      local_158 = "extracting";
    }
    poVar4 = color::operator<<((ostream *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffde0);
    poVar4 = std::operator<<(poVar4,"Use the --gog option to try ");
    poVar4 = std::operator<<(poVar4,local_158);
    poVar4 = std::operator<<(poVar4," ");
    pcVar5 = "this file";
    if (1 < local_98) {
      pcVar5 = "these files";
    }
    poVar4 = std::operator<<(poVar4,pcVar5);
    command.command = (char *)std::operator<<(poVar4,".\n");
    color::operator<<((ostream *)in_stack_fffffffffffffdd8,command);
  }
  std::__cxx11::string::~string(local_60);
  std::_Destroy<std::__cxx11::string>((path *)0x13fbd4);
  return;
}

Assistant:

void probe_bin_files(const extract_options & o, const setup::info & info,
                     const fs::path & setup_file, bool external) {
	
	boost::filesystem::path dir = setup_file.parent_path();
	std::string basename = util::as_string(setup_file.stem());
	
	size_t bin_count = 0;
	bin_count += probe_bin_file_series(o, info, dir, basename + ".bin");
	bin_count += probe_bin_file_series(o, info, dir, basename + "-0" + ".bin");
	

	boost::uint32_t max_slice = 0;
	if(external) {
		BOOST_FOREACH(const setup::data_entry & location, info.data_entries) {
			max_slice = std::max(max_slice, location.chunk.first_slice);
			max_slice = std::max(max_slice, location.chunk.last_slice);
		}
	}
	
	size_t slice =  0;
	size_t format = 1;
	if(external && info.header.slices_per_disk == 1) {
		slice = size_t(max_slice) + 1;
	}
	bin_count += probe_bin_file_series(o, info, dir, basename, format, slice);
	
	slice = 0;
	format = 2;
	if(external && info.header.slices_per_disk != 1) {
		slice = size_t(max_slice) + 1;
		format = info.header.slices_per_disk;
	}
	bin_count += probe_bin_file_series(o, info, dir, basename, format, slice);
	
	if(bin_count) {
		const char * verb = "inspecting";
		if(o.extract) {
			verb = "extracting";
		} else if(o.test) {
			verb = "testing";
		} else if(o.list) {
			verb = "listing the contents of";
		}
		std::cerr << color::yellow << "Use the --gog option to try " << verb << " "
		          << (bin_count > 1 ? "these files" : "this file") << ".\n" << color::reset;
	}
	
}